

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O3

mraa_result_t mraa_led_clear_trigger(mraa_led_context dev)

{
  mraa_result_t mVar1;
  __off_t _Var2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  char *__fmt;
  int __fd;
  
  if (dev == (mraa_led_context)0x0) {
    syslog(3,"led: clear_trigger: context is invalid");
    mVar1 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if (dev->trig_fd != -1) {
      close(dev->trig_fd);
      dev->trig_fd = -1;
    }
    if (dev->max_bright_fd != -1) {
      close(dev->max_bright_fd);
      dev->max_bright_fd = -1;
    }
    __fd = dev->bright_fd;
    if (__fd == -1) {
      mVar1 = mraa_led_get_brightfd(dev);
      if (mVar1 != MRAA_SUCCESS) {
        return MRAA_ERROR_INVALID_RESOURCE;
      }
      __fd = dev->bright_fd;
    }
    _Var2 = lseek(__fd,0,0);
    if (_Var2 == -1) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      __fmt = "led: clear_trigger: Failed to lseek \'brightness\': %s";
    }
    else {
      sVar3 = write(dev->bright_fd,&DAT_00126ac2,1);
      if (sVar3 != -1) {
        return MRAA_SUCCESS;
      }
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      __fmt = "led: clear_trigger: Failed to write \'brightness\': %s";
    }
    syslog(3,__fmt,pcVar5);
    mVar1 = MRAA_ERROR_UNSPECIFIED;
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_led_clear_trigger(mraa_led_context dev)
{
    char buf[1] = { '0' };

    if (dev == NULL) {
        syslog(LOG_ERR, "led: clear_trigger: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (dev->trig_fd != -1) {
        close(dev->trig_fd);
        dev->trig_fd = -1;
    }

    if (dev->max_bright_fd != -1) {
        close(dev->max_bright_fd);
        dev->max_bright_fd = -1;
    }

    if (dev->bright_fd == -1) {
        if (mraa_led_get_brightfd(dev) != MRAA_SUCCESS) {
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    }

    if (lseek(dev->bright_fd, 0, SEEK_SET) == -1) {
        syslog(LOG_ERR, "led: clear_trigger: Failed to lseek 'brightness': %s", strerror(errno));
        return MRAA_ERROR_UNSPECIFIED;
    }

    /* writing 0 to brightness clears trigger */
    if (write(dev->bright_fd, buf, 1) == -1) {
        syslog(LOG_ERR, "led: clear_trigger: Failed to write 'brightness': %s", strerror(errno));
        return MRAA_ERROR_UNSPECIFIED;
    }

    return MRAA_SUCCESS;
}